

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitializeAllocations(ScriptContext *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  CharClassifier *this_00;
  InlineCacheAllocator *pIVar2;
  InlineCache *pIVar3;
  uint *puVar4;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  ArenaAllocator *pAVar6;
  StringProfiler *this_01;
  PageAllocator *pageAllocator;
  BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar7;
  HeapAllocator *alloc;
  DebugContext *this_02;
  TrackAllocData local_268;
  code *local_240;
  undefined8 local_238;
  TrackAllocData local_230;
  code *local_208;
  undefined8 local_200;
  TrackAllocData local_1f8;
  code *local_1d0;
  undefined8 local_1c8;
  TrackAllocData local_1c0;
  code *local_198;
  undefined8 local_190;
  TrackAllocData local_188;
  code *local_160;
  undefined8 local_158;
  TrackAllocData local_150;
  code *local_128;
  undefined8 local_120;
  TrackAllocData local_118;
  code *local_f0;
  undefined8 local_e8;
  TrackAllocData local_e0;
  code *local_b8;
  undefined8 local_b0;
  TrackAllocData local_a8;
  code *local_80;
  undefined8 local_78;
  TrackAllocData local_70;
  code *local_48;
  undefined8 local_40;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&CharClassifier::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x156);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_38);
  local_48 = Memory::ArenaAllocator::Alloc;
  local_40 = 0;
  this_00 = (CharClassifier *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar1,0x3f67b0);
  CharClassifier::CharClassifier(this_00);
  this->charClassifier = this_00;
  pIVar2 = GetInlineCacheAllocator(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&InlineCache::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x158);
  pIVar2 = (InlineCacheAllocator *)
           Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
           TrackAllocInfo(&pIVar2->
                           super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                          ,&local_70);
  local_80 = Memory::InlineCacheAllocator::AllocZero;
  local_78 = 0;
  pIVar3 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,pIVar2,0xa3a9c0);
  InlineCache::InlineCache(pIVar3);
  this->valueOfInlineCache = pIVar3;
  pIVar2 = GetInlineCacheAllocator(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a8,(type_info *)&InlineCache::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x159);
  pIVar2 = (InlineCacheAllocator *)
           Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
           TrackAllocInfo(&pIVar2->
                           super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                          ,&local_a8);
  local_b8 = Memory::InlineCacheAllocator::AllocZero;
  local_b0 = 0;
  pIVar3 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,pIVar2,0xa3a9c0);
  InlineCache::InlineCache(pIVar3);
  this->toStringInlineCache = pIVar3;
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_e0,(type_info *)&unsigned_int::typeinfo,0,0x2d,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x15c);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_e0);
  local_f0 = Memory::ArenaAllocator::AllocZero;
  local_e8 = 0;
  puVar4 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,0x2d);
  this->rejitReasonCounts = puVar4;
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_118,(type_info *)&unsigned_int::typeinfo,0,0x2d,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x15d);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_118);
  local_128 = Memory::ArenaAllocator::AllocZero;
  local_120 = 0;
  puVar4 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,0x2d);
  this->rejitReasonCountsCap = puVar4;
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_150,
             (type_info *)
             &JsUtil::
              BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x15e);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_150);
  local_160 = Memory::ArenaAllocator::Alloc;
  local_158 = 0;
  pBVar5 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
  pAVar6 = GeneralAllocator(this);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar5,pAVar6,0);
  this->bailoutReasonCounts = pBVar5;
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_188,
             (type_info *)
             &JsUtil::
              BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x15f);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_188);
  local_198 = Memory::ArenaAllocator::Alloc;
  local_190 = 0;
  pBVar5 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
  pAVar6 = GeneralAllocator(this);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar5,pAVar6,0);
  this->bailoutReasonCountsCap = pBVar5;
  if ((DAT_01ebb8a0 & 1) != 0) {
    pAVar1 = &MiscAllocator(this)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1c0,(type_info *)&StringProfiler::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x16a);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_1c0);
    local_1d0 = Memory::ArenaAllocator::Alloc;
    local_1c8 = 0;
    this_01 = (StringProfiler *)new<Memory::ArenaAllocator>(0x110,(ArenaAllocator *)pAVar1,0x3f67b0)
    ;
    pageAllocator = ThreadContext::GetPageAllocator(this->threadContext);
    StringProfiler::StringProfiler(this_01,pageAllocator);
    this->stringProfiler = this_01;
  }
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1f8,
             (type_info *)
             &JsUtil::
              BaseHashSet<int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x16d);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_1f8);
  local_208 = Memory::ArenaAllocator::Alloc;
  local_200 = 0;
  pBVar7 = (BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
  pAVar6 = GeneralAllocator(this);
  JsUtil::
  BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(pBVar7,pAVar6,0);
  this->intConstPropsOnGlobalObject = pBVar7;
  pAVar1 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_230,
             (type_info *)
             &JsUtil::
              BaseHashSet<int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x16e);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_230);
  local_240 = Memory::ArenaAllocator::Alloc;
  local_238 = 0;
  pBVar7 = (BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
  pAVar6 = GeneralAllocator(this);
  JsUtil::
  BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(pBVar7,pAVar6,0);
  this->intConstPropsOnGlobalUserObject = pBVar7;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_268,(type_info *)&DebugContext::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x171);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_268);
  this_02 = (DebugContext *)new<Memory::HeapAllocator>(0x20,alloc,0x350bd0);
  DebugContext::DebugContext(this_02,this);
  this->debugContext = this_02;
  return;
}

Assistant:

void ScriptContext::InitializeAllocations()
    {
        this->charClassifier = Anew(GeneralAllocator(), CharClassifier);

        this->valueOfInlineCache = AllocatorNewZ(InlineCacheAllocator, GetInlineCacheAllocator(), InlineCache);
        this->toStringInlineCache = AllocatorNewZ(InlineCacheAllocator, GetInlineCacheAllocator(), InlineCache);

#ifdef REJIT_STATS
        rejitReasonCounts = AnewArrayZ(GeneralAllocator(), uint, NumRejitReasons);
        rejitReasonCountsCap = AnewArrayZ(GeneralAllocator(), uint, NumRejitReasons);
        bailoutReasonCounts = Anew(GeneralAllocator(), BailoutStatsMap, GeneralAllocator());
        bailoutReasonCountsCap = Anew(GeneralAllocator(), BailoutStatsMap, GeneralAllocator());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        // TODO - allocate this on the Heap instead of using a custom allocator?
        this->telemetry = Anew(this->TelemetryAllocator(), Js::ScriptContextTelemetry, this);
#endif

#ifdef PROFILE_STRINGS
        if (Js::Configuration::Global.flags.ProfileStrings)
        {
            stringProfiler = Anew(MiscAllocator(), StringProfiler, threadContext->GetPageAllocator());
        }
#endif
        intConstPropsOnGlobalObject = Anew(GeneralAllocator(), PropIdSetForConstProp, GeneralAllocator());
        intConstPropsOnGlobalUserObject = Anew(GeneralAllocator(), PropIdSetForConstProp, GeneralAllocator());

#ifdef ENABLE_SCRIPT_DEBUGGING
        this->debugContext = HeapNew(DebugContext, this);
#endif
    }